

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_document::document_element(xml_document *this)

{
  xml_node_struct *pxVar1;
  xml_node_struct **ppxVar2;
  
  ppxVar2 = &((this->super_xml_node)._root)->first_child;
  while( true ) {
    pxVar1 = *ppxVar2;
    if ((pxVar1 == (xml_node_struct *)0x0) || ((pxVar1->header & 0xf) == 2)) break;
    ppxVar2 = &pxVar1->next_sibling;
  }
  return (xml_node)pxVar1;
}

Assistant:

PUGI__FN xml_node xml_document::document_element() const
	{
		assert(_root);

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (PUGI__NODETYPE(i) == node_element)
				return xml_node(i);

		return xml_node();
	}